

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O1

GENERAL_NAME *
v2i_GENERAL_NAME_ex(GENERAL_NAME *out,X509V3_EXT_METHOD *method,X509V3_CTX *ctx,CONF_VALUE *cnf,
                   int is_nc)

{
  bool bVar1;
  int iVar2;
  GENERAL_NAME *a;
  ASN1_IA5STRING *str;
  size_t sVar3;
  ASN1_OCTET_STRING *pAVar4;
  ASN1_OBJECT *pAVar5;
  char *pcVar6;
  OTHERNAME *a_00;
  char *pcVar7;
  ASN1_TYPE *pAVar8;
  stack_st_CONF_VALUE *dn_sk;
  X509_NAME *nm;
  GENERAL_NAME *pGVar9;
  int iVar10;
  
  pcVar7 = cnf->value;
  if (pcVar7 == (char *)0x0) {
    ERR_put_error(0x14,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1f5);
    return (GENERAL_NAME *)0x0;
  }
  pcVar6 = cnf->name;
  iVar2 = x509v3_conf_name_matches(pcVar6,"email");
  iVar10 = 1;
  if (iVar2 == 0) {
    iVar2 = x509v3_conf_name_matches(pcVar6,"URI");
    iVar10 = 6;
    if (iVar2 == 0) {
      iVar2 = x509v3_conf_name_matches(pcVar6,"DNS");
      iVar10 = 2;
      if (iVar2 == 0) {
        iVar2 = x509v3_conf_name_matches(pcVar6,"RID");
        iVar10 = 8;
        if (iVar2 == 0) {
          iVar2 = x509v3_conf_name_matches(pcVar6,"IP");
          iVar10 = 7;
          if (iVar2 == 0) {
            iVar2 = x509v3_conf_name_matches(pcVar6,"dirName");
            iVar10 = 4;
            if (iVar2 == 0) {
              iVar2 = x509v3_conf_name_matches(pcVar6,"otherName");
              iVar10 = 0;
              if (iVar2 == 0) {
                ERR_put_error(0x14,0,0xa0,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                              ,0x209);
                ERR_add_error_data(2,"name=",pcVar6);
                return (GENERAL_NAME *)0x0;
              }
            }
          }
        }
      }
    }
  }
  a = out;
  if ((out == (GENERAL_NAME *)0x0) && (a = GENERAL_NAME_new(), a == (GENERAL_NAME *)0x0)) {
    return (GENERAL_NAME *)0x0;
  }
  switch(iVar10) {
  case 0:
    pcVar6 = strchr(pcVar7,0x3b);
    if ((pcVar6 != (char *)0x0) && (a_00 = OTHERNAME_new(), a_00 != (OTHERNAME *)0x0)) {
      pcVar7 = OPENSSL_strndup(pcVar7,(long)pcVar6 - (long)pcVar7);
      if (pcVar7 != (char *)0x0) {
        ASN1_OBJECT_free(a_00->type_id);
        pAVar5 = OBJ_txt2obj(pcVar7,0);
        a_00->type_id = pAVar5;
        OPENSSL_free(pcVar7);
        if (a_00->type_id != (ASN1_OBJECT *)0x0) {
          ASN1_TYPE_free(a_00->value);
          pAVar8 = ASN1_generate_v3(pcVar6 + 1,ctx);
          a_00->value = pAVar8;
          if (pAVar8 != (ASN1_TYPE *)0x0) {
            a->type = 0;
            (a->d).otherName = a_00;
            return a;
          }
        }
      }
      OTHERNAME_free(a_00);
    }
    iVar2 = 0x94;
    iVar10 = 0x1dc;
    break;
  case 1:
  case 2:
  case 6:
    str = ASN1_IA5STRING_new();
    if (str == (ASN1_IA5STRING *)0x0) {
LAB_0032da4d:
      ASN1_STRING_free(str);
      bVar1 = false;
    }
    else {
      sVar3 = strlen(pcVar7);
      iVar2 = ASN1_STRING_set(str,pcVar7,(int)sVar3);
      if (iVar2 == 0) goto LAB_0032da4d;
      a->type = iVar10;
      (a->d).rfc822Name = str;
      bVar1 = true;
    }
    pGVar9 = (GENERAL_NAME *)0x0;
    if (bVar1) {
      pGVar9 = a;
    }
    if (out != (GENERAL_NAME *)0x0 || bVar1) {
      return pGVar9;
    }
    goto LAB_0032dcda;
  default:
    iVar2 = 0xa1;
    iVar10 = 0x1e1;
    break;
  case 4:
    dn_sk = X509V3_get_section(ctx,pcVar7);
    nm = X509_NAME_new();
    if (nm != (X509_NAME *)0x0) {
      if (dn_sk == (stack_st_CONF_VALUE *)0x0) {
        ERR_put_error(0x14,0,0x99,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                      ,0x240);
        ERR_add_error_data(2,"section=",pcVar7);
      }
      else {
        iVar2 = X509V3_NAME_from_section(nm,dn_sk,0x1001);
        if (iVar2 != 0) {
          a->type = 4;
          (a->d).directoryName = nm;
          return a;
        }
      }
    }
    X509_NAME_free(nm);
    iVar2 = 0x69;
    iVar10 = 0x1d5;
    break;
  case 7:
    a->type = 7;
    if (is_nc == 0) {
      pAVar4 = a2i_IPADDRESS(pcVar7);
    }
    else {
      pAVar4 = a2i_IPADDRESS_NC(pcVar7);
    }
    (a->d).iPAddress = pAVar4;
    if (pAVar4 != (ASN1_OCTET_STRING *)0x0) {
      return a;
    }
    ERR_put_error(0x14,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1cd);
    ERR_add_error_data(2,"value=",pcVar7);
    goto LAB_0032dcd5;
  case 8:
    pAVar5 = OBJ_txt2obj(pcVar7,0);
    if (pAVar5 == (ASN1_OBJECT *)0x0) {
      pGVar9 = (GENERAL_NAME *)0x0;
      ERR_put_error(0x14,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                    ,0x1bc);
      ERR_add_error_data(2,"value=",pcVar7);
    }
    else {
      a->type = 8;
      (a->d).registeredID = pAVar5;
      pGVar9 = a;
    }
    if (out != (GENERAL_NAME *)0x0 || pAVar5 != (ASN1_OBJECT *)0x0) {
      return pGVar9;
    }
    goto LAB_0032dcda;
  }
  ERR_put_error(0x14,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                ,iVar10);
LAB_0032dcd5:
  if (out == (GENERAL_NAME *)0x0) {
LAB_0032dcda:
    GENERAL_NAME_free(a);
  }
  return (GENERAL_NAME *)0x0;
}

Assistant:

GENERAL_NAME *v2i_GENERAL_NAME_ex(GENERAL_NAME *out,
                                  const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx, const CONF_VALUE *cnf,
                                  int is_nc) {
  const char *name = cnf->name;
  const char *value = cnf->value;
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
    return NULL;
  }

  int type;
  if (x509v3_conf_name_matches(name, "email")) {
    type = GEN_EMAIL;
  } else if (x509v3_conf_name_matches(name, "URI")) {
    type = GEN_URI;
  } else if (x509v3_conf_name_matches(name, "DNS")) {
    type = GEN_DNS;
  } else if (x509v3_conf_name_matches(name, "RID")) {
    type = GEN_RID;
  } else if (x509v3_conf_name_matches(name, "IP")) {
    type = GEN_IPADD;
  } else if (x509v3_conf_name_matches(name, "dirName")) {
    type = GEN_DIRNAME;
  } else if (x509v3_conf_name_matches(name, "otherName")) {
    type = GEN_OTHERNAME;
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNSUPPORTED_OPTION);
    ERR_add_error_data(2, "name=", name);
    return NULL;
  }

  return a2i_GENERAL_NAME(out, method, ctx, type, value, is_nc);
}